

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void CostManagerClear(CostManager *manager)

{
  CostInterval *in_RDI;
  
  if (in_RDI != (CostInterval *)0x0) {
    WebPSafeFree((void *)0x1d162e);
    WebPSafeFree((void *)0x1d163b);
    DeleteIntervalList(manager,in_RDI);
    in_RDI->cost = 0;
    DeleteIntervalList(manager,in_RDI);
    *(undefined8 *)&in_RDI[0x33e].index = 0;
    memset(in_RDI,0,0x81c8);
    CostManagerInitFreeList(manager);
  }
  return;
}

Assistant:

static void CostManagerClear(CostManager* const manager) {
  if (manager == NULL) return;

  WebPSafeFree(manager->costs);
  WebPSafeFree(manager->cache_intervals);

  // Clear the interval lists.
  DeleteIntervalList(manager, manager->head);
  manager->head = NULL;
  DeleteIntervalList(manager, manager->recycled_intervals);
  manager->recycled_intervals = NULL;

  // Reset pointers, 'count' and 'cache_intervals_size'.
  memset(manager, 0, sizeof(*manager));
  CostManagerInitFreeList(manager);
}